

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::CloudGroup> *
metaf::CloudGroup::parse
          (optional<metaf::CloudGroup> *__return_storage_ptr__,string *group,ReportPart reportPart,
          ReportMetadata *reportMetadata)

{
  bool bVar1;
  optional<metaf::CloudType> ct;
  _Storage<metaf::CloudType,_true> local_38;
  char local_20;
  
  if ((reportPart & ~HEADER) == METAR) {
    parseCloudLayerOrVertVis(__return_storage_ptr__,group);
  }
  else if (reportPart == RMK) {
    bVar1 = std::operator==(group,"CLD");
    if (bVar1) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::CloudGroup>._M_payload = 6;
      (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.heightOrVertVis.
      distModifier = NONE;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x10) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x14) = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x20) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x24) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.w.data = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x40) = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x4c) = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x58) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x5c) = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x68) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x6c) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.incompleteText = CLD;
    }
    else {
      bVar1 = std::operator==(group,"CIG");
      if (bVar1) {
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::CloudGroup>._M_payload = 3;
        (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.heightOrVertVis.
        distModifier = NONE;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x10) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x14) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x20) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x24) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.w.data = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x40) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x4c) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x58) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x5c) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x68) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x6c) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.incompleteText = CIG;
      }
      else {
        bVar1 = std::operator==(group,"CHINO");
        if (bVar1) {
          *(undefined8 *)
           &(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload
            .super__Optional_payload_base<metaf::CloudGroup>._M_payload = 5;
          (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.heightOrVertVis.
          distModifier = NONE;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x10) = 0
          ;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x14) = 0
          ;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x20) = 0
          ;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x24) = 0
          ;
          (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.w.data = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x40) = 0
          ;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x4c) = 0
          ;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x58) = 0
          ;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x5c) = 0
          ;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x68) = 0
          ;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x6c) = 0
          ;
          (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.incompleteText = CHINO
          ;
        }
        else {
          CloudType::fromStringObscuration((optional<metaf::CloudType> *)&local_38._M_value,group);
          if (local_20 != '\x01') {
            parseVariableCloudLayer(__return_storage_ptr__,group);
            return __return_storage_ptr__;
          }
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x6b) =
               local_38._15_1_;
          *(undefined2 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x69) =
               local_38._13_2_;
          *(undefined8 *)
           &(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload
            .super__Optional_payload_base<metaf::CloudGroup>._M_payload = 7;
          (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.heightOrVertVis.
          distModifier = NONE;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x10) = 0
          ;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x14) = 0
          ;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x20) = 0
          ;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x24) = 0
          ;
          (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.w.data = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x40) = 0
          ;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x4c) = 0
          ;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x58) = 0
          ;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x5c) =
               local_38._0_8_;
          *(_Storage<unsigned_int,_true> *)
           &(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload
            .super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.cldTp.ht.dist =
               local_38._M_value.ht.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload;
          *(bool *)((long)&(__return_storage_ptr__->
                           super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
                           super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x68) =
               local_38._M_value.ht.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x6c) =
               local_38._16_8_;
          (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.incompleteText =
               OBSCURATION;
        }
      }
    }
    (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::CloudGroup>._M_engaged = true;
  }
  else {
    (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::CloudGroup>._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<CloudGroup> CloudGroup::parse(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	if (reportPart == ReportPart::METAR || reportPart == ReportPart::TAF)
		return parseCloudLayerOrVertVis(group);

	if (reportPart == ReportPart::RMK) {
		if (group == "CLD") return CloudGroup(Type::CLD_MISG, IncompleteText::CLD);
		if (group == "CIG") return CloudGroup(Type::CEILING, IncompleteText::CIG);
		if (group == "CHINO") return CloudGroup(Type::CHINO, IncompleteText::CHINO);
		if (const auto ct = CloudType::fromStringObscuration(group); ct.has_value()) {
			CloudGroup result = CloudGroup(Type::OBSCURATION, IncompleteText::OBSCURATION);
			result.cldTp = *ct;
			return result;
		}
		return parseVariableCloudLayer(group); 
	}
	return std::optional<CloudGroup>();
}